

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O2

void __thiscall
VW::config::options_boost_po::
add_to_description_impl<VW::config::typelist<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<char,std::allocator<char>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (options_boost_po *this,shared_ptr<VW::config::base_option> *opt,
          options_description *options_description)

{
  bool bVar1;
  __shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&opt->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>
            );
  bVar1 = add_if_t<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    (this,(shared_ptr<VW::config::base_option> *)&local_40,options_description);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  if (!bVar1) {
    std::__shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               &opt->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>);
    add_to_description_impl<VW::config::typelist<std::vector<float,std::allocator<float>>,std::vector<double,std::allocator<double>>,std::vector<char,std::allocator<char>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (this,(shared_ptr<VW::config::base_option> *)&local_50,options_description);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  }
  return;
}

Assistant:

void add_to_description_impl(std::shared_ptr<base_option> opt, po::options_description& options_description)
  {
    if (add_if_t<typename TTypes::head>(opt, options_description))
    {
      return;
    }
    add_to_description_impl<typename TTypes::tail>(opt, options_description);
  }